

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

int i2d_RSAPrivateKey(RSA *a,uchar **out)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB cbb;
  uint8_t **outp_local;
  RSA *in_local;
  
  cbb.u._24_8_ = out;
  iVar1 = CBB_init((CBB *)local_50,0);
  if ((iVar1 != 0) && (iVar1 = RSA_marshal_private_key((CBB *)local_50,(RSA *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d((CBB *)local_50,(uint8_t **)cbb.u._24_8_);
    return iVar1;
  }
  CBB_cleanup((CBB *)local_50);
  return -1;
}

Assistant:

int i2d_RSAPrivateKey(const RSA *in, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !RSA_marshal_private_key(&cbb, in)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}